

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O0

bool __thiscall ON_ParseSettings::IsInteriorWhiteSpace(ON_ParseSettings *this,ON__UINT32 c)

{
  bool bVar1;
  ON__UINT32 c_local;
  ON_ParseSettings *this_local;
  
  if (c == 9) {
    bVar1 = ParseHorizontalTabAsWhiteSpace(this);
    if (bVar1) {
      return true;
    }
LAB_007bfbb3:
    this_local._7_1_ = false;
  }
  else {
    if (c == 0x20) {
      bVar1 = ParseSpaceAsWhiteSpace(this);
      if (bVar1) {
        return true;
      }
    }
    else if (c != 0xa0) {
      if (c - 0x2008 < 3) {
        bVar1 = ParseThinSpaceAsWhiteSpace(this);
        return bVar1;
      }
      if (c == 0x202f) {
        bVar1 = ParseNoBreakThinSpaceAsWhiteSpace(this);
        return bVar1;
      }
      goto LAB_007bfbb3;
    }
    this_local._7_1_ = ParseNoBreakSpaceAsWhiteSpace(this);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ParseSettings::IsInteriorWhiteSpace(ON__UINT32 c) const
{
  switch(c)
  {
  case 0x0009: // horizontal tab
    if ( ParseHorizontalTabAsWhiteSpace() )
      return true;
    break;

  case 0x0020: // space
    if ( ParseSpaceAsWhiteSpace() )
      return true;

  case 0x00A0: // no-break space
    return ParseNoBreakSpaceAsWhiteSpace();
    break;

  case 0x2008: // thin space
  case 0x2009: // thin space
  case 0x200A: // hair thin space
    return ParseThinSpaceAsWhiteSpace();
    break;

  case 0x202F: // narrow no-break
    return ParseNoBreakThinSpaceAsWhiteSpace();
    break;
  }

  return false;
}